

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Socket::Poll::Private::poll(Private *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  Socket **key;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ssize_t sVar5;
  Iterator *pIVar6;
  pollfd *ppVar7;
  uint *puVar8;
  Iterator local_360;
  Iterator it;
  uint64 val;
  Socket **local_348;
  SocketInfo *sockInfo;
  epoll_event *end;
  epoll_event *i;
  undefined1 auStack_328 [3];
  bool interrupted;
  int count;
  epoll_event events [64];
  int64 timeout_local;
  Event *event_local;
  Private *this_local;
  
  events[0x3f].data = (epoll_data_t)__nfds;
  bVar2 = HashMap<Socket_*,_unsigned_int>::isEmpty(&this->selectedSockets);
  if (bVar2) {
    i._4_4_ = epoll_wait(this->fd,(epoll_event *)auStack_328,0x40,events[0x3f].data.fd);
    i._3_1_ = 0;
    sockInfo = (SocketInfo *)(auStack_328 + (long)i._4_4_ * 0xc);
    for (end = (epoll_event *)auStack_328; end < sockInfo; end = end + 1) {
      key = (Socket **)(end->data).ptr;
      local_348 = key;
      if (key == (Socket **)0x0) {
        if ((end->events & 1) != 0) {
          i._3_1_ = 1;
        }
      }
      else {
        val._4_4_ = unmapEvents(end->events,*(uint *)(key + 1));
        HashMap<Socket_*,_unsigned_int>::append(&this->selectedSockets,key,(uint *)((long)&val + 4))
        ;
      }
    }
    bVar2 = HashMap<Socket_*,_unsigned_int>::isEmpty(&this->selectedSockets);
    if ((bVar2) || ((i._3_1_ & 1) != 0)) {
      if (((i._3_1_ & 1) != 0) &&
         ((sVar5 = read(this->eventFd,&it,8), sVar5 != 8 &&
          (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Socket/Socket.cpp"
                                 ,0x502,"read(eventFd, &val, sizeof(val)) == sizeof(val)"),
          iVar3 != 0)))) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      __fds->fd = 0;
      __fds[1].fd = 0;
      __fds[1].events = 0;
      __fds[1].revents = 0;
      goto LAB_0011af1c;
    }
  }
  pIVar6 = HashMap<Socket_*,_unsigned_int>::begin(&this->selectedSockets);
  local_360.item = pIVar6->item;
  ppVar7 = (pollfd *)HashMap<Socket_*,_unsigned_int>::Iterator::key(&local_360);
  __fds[1] = *ppVar7;
  puVar8 = HashMap<Socket_*,_unsigned_int>::Iterator::operator*(&local_360);
  __fds->fd = *puVar8;
  uVar4 = HashMap<Socket_*,_unsigned_int>::remove(&this->selectedSockets,(char *)&local_360);
  __fds = (pollfd *)(ulong)uVar4;
LAB_0011af1c:
  return (int)CONCAT71((int7)((ulong)__fds >> 8),1);
}

Assistant:

bool Socket::Poll::Private::poll(Event& event, int64 timeout)
{
  if(selectedSockets.isEmpty())
  {
    epoll_event events[64];
    int count = ::epoll_wait(fd, events, sizeof(events) / sizeof(*events), timeout);
    bool interrupted = false;
    for(epoll_event* i = events, * end = events + count; i < end; ++i)
    {
      Private::SocketInfo* sockInfo = (Private::SocketInfo*)i->data.ptr;
      if(sockInfo)
        selectedSockets.append(sockInfo->socket, unmapEvents(i->events, sockInfo->events));
      else if(i->events & EPOLLIN)
        interrupted = true;
    }

    if(selectedSockets.isEmpty() || interrupted)
    {
      if(interrupted)
      {
        uint64 val;
        VERIFY(read(eventFd, &val, sizeof(val)) == sizeof(val));
      }
      event.flags = 0;
      event.socket = 0;
      return true; // timeout or interrupt
    }
  }

  HashMap<Socket*, uint>::Iterator it = selectedSockets.begin();
  event.socket = it.key();
  event.flags = *it;
  selectedSockets.remove(it);
  return true;
}